

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<double,double,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,double *v,double v_min,double v_max,
               char *format,float power,ImGuiSliderFlags flags)

{
  ImDrawList *this;
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  ImGuiWindow *pIVar5;
  ImGuiCol idx;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  float fVar9;
  float a_00;
  float fVar10;
  double dVar11;
  double dVar12;
  ImVec2 IVar13;
  float local_164;
  float local_160;
  float local_15c;
  float local_154;
  double local_150;
  double local_148;
  float local_140;
  float local_13c;
  double local_138;
  float local_12c;
  bool local_125;
  ImGuiCol local_124;
  ImRect local_120;
  ImRect local_110;
  undefined1 local_100 [8];
  ImRect grab_bb;
  float grab_pos;
  float grab_t;
  double v_new_off_round;
  double v_new_off_floor;
  double v_new_off_f;
  float a_1;
  float a;
  double v_new;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  double linear_dist_max_to_0;
  double linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  double v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  bool is_horizontal;
  ImU32 frame_col;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiSliderFlags flags_local;
  float power_local;
  char *format_local;
  double v_max_local;
  double v_min_local;
  double *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar2 = GImGui;
  pIVar5 = GetCurrentWindow();
  if (pIVar2->ActiveId == id) {
    local_124 = 9;
  }
  else {
    local_124 = 7;
    if (pIVar2->HoveredId == id) {
      local_124 = 8;
    }
  }
  IVar4 = GetColorU32(local_124,1.0);
  RenderNavHighlight(bb,id,1);
  RenderFrame(bb->Min,bb->Max,IVar4,true,(pIVar2->Style).FrameRounding);
  bVar6 = (flags & 1U) != 0;
  bVar7 = data_type == 4;
  bVar8 = data_type == 5;
  local_125 = bVar7 || bVar8;
  bVar1 = local_125;
  if ((power == 1.0) && (!NAN(power))) {
    bVar1 = false;
  }
  if (bVar6) {
    local_12c = ImRect::GetHeight(bb);
  }
  else {
    local_12c = ImRect::GetWidth(bb);
  }
  local_12c = local_12c - 4.0;
  v_range._0_4_ = (pIVar2->Style).GrabMinSize;
  if (v_max <= v_min) {
    local_138 = v_min - v_max;
  }
  else {
    local_138 = v_max - v_min;
  }
  if ((!bVar7 && !bVar8) && (0.0 <= local_138)) {
    v_range._0_4_ =
         ImMax<float>((float)((double)local_12c / (local_138 + 1.0)),(pIVar2->Style).GrabMinSize);
  }
  fVar9 = ImMin<float>(v_range._0_4_,local_12c);
  if (bVar6) {
    local_13c = (bb->Min).y;
  }
  else {
    local_13c = (bb->Min).x;
  }
  a_00 = fVar9 * 0.5 + local_13c + 2.0;
  if (bVar6) {
    local_140 = (bb->Max).y;
  }
  else {
    local_140 = (bb->Max).x;
  }
  if ((!bVar1) || (0.0 <= v_min * v_max)) {
    local_154 = 1.0;
    if (0.0 <= v_min) {
      local_154 = 0.0;
    }
    linear_dist_min_to_0._0_4_ = local_154;
  }
  else {
    local_148 = v_min;
    if (v_min < 0.0) {
      local_148 = -v_min;
    }
    dVar11 = ImPow(local_148,1.0 / (double)power);
    local_150 = v_max;
    if (v_max < 0.0) {
      local_150 = -v_max;
    }
    dVar12 = ImPow(local_150,1.0 / (double)power);
    linear_dist_min_to_0._0_4_ = (float)(dVar11 / (dVar11 + dVar12));
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar2->ActiveId == id) {
    bVar3 = false;
    delta2.y = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar2->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        if (bVar6) {
          local_15c = (pIVar2->IO).MousePos.y;
        }
        else {
          local_15c = (pIVar2->IO).MousePos.x;
        }
        if (local_12c - fVar9 <= 0.0) {
          local_160 = 0.0;
        }
        else {
          local_160 = ImClamp<float>((local_15c - a_00) / (local_12c - fVar9),0.0,1.0);
        }
        delta2.y = local_160;
        if (bVar6) {
          delta2.y = 1.0 - local_160;
        }
        bVar3 = true;
      }
    }
    else if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar13 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      if (bVar6) {
        delta = IVar13.y;
        local_164 = -delta;
      }
      else {
        v_new._4_4_ = IVar13.x;
        local_164 = v_new._4_4_;
      }
      if ((pIVar2->NavActivatePressedId == id) && ((pIVar2->ActiveIdIsJustActivated & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((local_164 != 0.0) || (NAN(local_164))) {
        delta2.y = SliderBehaviorCalcRatioFromValue<double,double>
                             (data_type,*v,v_min,v_max,power,linear_dist_min_to_0._0_4_);
        if ((local_125) || (bVar1)) {
          v_new._0_4_ = local_164 / 100.0;
          bVar3 = IsNavInputDown(0xe);
          if (bVar3) {
            v_new._0_4_ = v_new._0_4_ / 10.0;
          }
        }
        else if (((-100.0 <= local_138) && (local_138 <= 100.0)) ||
                (bVar3 = IsNavInputDown(0xe), bVar3)) {
          v_new._0_4_ = (float)(~-(uint)(local_164 < 0.0) & 0x3f800000 |
                               -(uint)(local_164 < 0.0) & 0xbf800000) / (float)local_138;
        }
        else {
          v_new._0_4_ = local_164 / 100.0;
        }
        bVar3 = IsNavInputDown(0xf);
        if (bVar3) {
          v_new._0_4_ = v_new._0_4_ * 10.0;
        }
        bVar3 = true;
        if (((1.0 <= delta2.y) && (0.0 < v_new._0_4_)) || ((delta2.y <= 0.0 && (v_new._0_4_ < 0.0)))
           ) {
          bVar3 = false;
        }
        else {
          delta2.y = ImSaturate(delta2.y + v_new._0_4_);
        }
      }
    }
    if (bVar3) {
      if (bVar1) {
        if (linear_dist_min_to_0._0_4_ <= delta2.y) {
          fVar10 = ImFabs(linear_dist_min_to_0._0_4_ - 1.0);
          if (fVar10 <= 1e-06) {
            v_new_off_f._0_4_ = delta2.y;
          }
          else {
            v_new_off_f._0_4_ =
                 (delta2.y - linear_dist_min_to_0._0_4_) / (1.0 - linear_dist_min_to_0._0_4_);
          }
          fVar10 = ImPow(v_new_off_f._0_4_,power);
          dVar11 = ImMax<double>(v_min,0.0);
          _a_1 = ImLerp<double>(dVar11,v_max,fVar10);
        }
        else {
          fVar10 = ImPow(1.0 - delta2.y / linear_dist_min_to_0._0_4_,power);
          dVar11 = ImMin<double>(v_max,0.0);
          _a_1 = ImLerp<double>(dVar11,v_min,fVar10);
        }
      }
      else if (bVar7 || bVar8) {
        _a_1 = ImLerp<double>(v_min,v_max,delta2.y);
      }
      else {
        _a_1 = (v_max - v_min) * (double)delta2.y;
        if ((!bVar7 && !bVar8) && (_a_1 < _a_1 + 0.5)) {
          _a_1 = _a_1 + 0.5;
        }
        _a_1 = v_min + _a_1;
      }
      dVar11 = RoundScalarWithFormat<double,double>(format,data_type,_a_1);
      if ((*v != dVar11) || (NAN(*v) || NAN(dVar11))) {
        *v = dVar11;
        mouse_abs_pos._3_1_ = true;
      }
    }
  }
  grab_bb.Max.y =
       SliderBehaviorCalcRatioFromValue<double,double>
                 (data_type,*v,v_min,v_max,power,linear_dist_min_to_0._0_4_);
  if (bVar6) {
    grab_bb.Max.y = 1.0 - grab_bb.Max.y;
  }
  grab_bb.Max.x = ImLerp<float>(a_00,-fVar9 * 0.5 + (local_140 - 2.0),grab_bb.Max.y);
  ImRect::ImRect((ImRect *)local_100);
  if (bVar6) {
    ImRect::ImRect(&local_120,(bb->Min).x + 2.0,-fVar9 * 0.5 + grab_bb.Max.x,(bb->Max).x - 2.0,
                   fVar9 * 0.5 + grab_bb.Max.x);
    local_100._0_4_ = local_120.Min.x;
    local_100._4_4_ = local_120.Min.y;
    grab_bb.Min = local_120.Max;
  }
  else {
    ImRect::ImRect(&local_110,-fVar9 * 0.5 + grab_bb.Max.x,(bb->Min).y + 2.0,
                   fVar9 * 0.5 + grab_bb.Max.x,(bb->Max).y - 2.0);
    local_100._0_4_ = local_110.Min.x;
    local_100._4_4_ = local_110.Min.y;
    grab_bb.Min = local_110.Max;
  }
  this = pIVar5->DrawList;
  idx = 0x13;
  if (pIVar2->ActiveId == id) {
    idx = 0x14;
  }
  IVar4 = GetColorU32(idx,1.0);
  ImDrawList::AddRectFilled
            (this,(ImVec2 *)local_100,&grab_bb.Min,IVar4,(pIVar2->Style).GrabRounding,0xf);
  return mouse_abs_pos._3_1_;
}

Assistant:

static bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = g.Style;

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, frame_col, true, style.FrameRounding);

    const bool is_horizontal = (flags & ImGuiSliderFlags_Vertical) == 0;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = is_horizontal ? (bb.GetWidth() - grab_padding * 2.0f) : (bb.GetHeight() - grab_padding * 2.0f);
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = (is_horizontal ? bb.Min.x : bb.Min.y) + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = (is_horizontal ? bb.Max.x : bb.Max.y) - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = is_horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (!is_horizontal)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = is_horizontal ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderBehaviorCalcRatioFromValue<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                if (is_decimal || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormat<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Draw
    float grab_t = SliderBehaviorCalcRatioFromValue<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (!is_horizontal)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    ImRect grab_bb;
    if (is_horizontal)
        grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);
    window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    return value_changed;
}